

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O3

string * __thiscall
project::get_linux_config_abi_cxx11_(string *__return_storage_ptr__,project *this)

{
  pointer pbVar1;
  pointer pbVar2;
  ostream *poVar3;
  _List_node_base *p_Var4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *library;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  pointer pbVar5;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  packages;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libs;
  buildExport b;
  stringstream ss;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_480;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_468;
  string local_450;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_430;
  buildExport local_418;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_418.targetFolder._M_dataplus._M_p = (pointer)&local_418.targetFolder.field_2;
  local_418.targetFolder._M_string_length = 0;
  local_418.targetFolder.field_2._M_local_buf[0] = '\0';
  local_418.cppLanguageStandard._M_dataplus._M_p = (pointer)&local_418.cppLanguageStandard.field_2;
  local_418.extraDefs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.extraDefs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.extraDefs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_418.externalLibraries.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.externalLibraries.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.externalLibraries.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_418.cppLanguageStandard._M_string_length = 0;
  local_418.cppLanguageStandard.field_2._M_local_buf[0] = '\0';
  local_418.extraCompilerFlags._M_dataplus._M_p = (pointer)&local_418.extraCompilerFlags.field_2;
  local_418.extraCompilerFlags._M_string_length = 0;
  local_418.extraCompilerFlags.field_2._M_local_buf[0] = '\0';
  local_418.extraLinkerFlags._M_dataplus._M_p = (pointer)&local_418.extraLinkerFlags.field_2;
  local_418.extraLinkerFlags._M_string_length = 0;
  local_418.extraLinkerFlags.field_2._M_local_buf[0] = '\0';
  local_418.extraFrameworks._M_dataplus._M_p = (pointer)&local_418.extraFrameworks.field_2;
  local_418.extraFrameworks._M_string_length = 0;
  local_418.extraFrameworks.field_2._M_local_buf[0] = '\0';
  local_418.smallIcon._M_dataplus._M_p = (pointer)&local_418.smallIcon.field_2;
  local_418.smallIcon._M_string_length = 0;
  local_418.smallIcon.field_2._M_local_buf[0] = '\0';
  local_418.bigIcon._M_dataplus._M_p = (pointer)&local_418.bigIcon.field_2;
  local_418.bigIcon._M_string_length = 0;
  local_418.bigIcon.field_2._M_local_buf[0] = '\0';
  local_418.vstLegacyFolder._M_dataplus._M_p = (pointer)&local_418.vstLegacyFolder.field_2;
  local_418.vstLegacyFolder._M_string_length = 0;
  local_418.vstLegacyFolder.field_2._M_local_buf[0] = '\0';
  local_418.vst3Folder._M_dataplus._M_p = (pointer)&local_418.vst3Folder.field_2;
  local_418.vst3Folder._M_string_length = 0;
  local_418.vst3Folder.field_2._M_local_buf[0] = '\0';
  local_418.debug.name._M_dataplus._M_p = (pointer)&local_418.debug.name.field_2;
  local_418.debug.name._M_string_length = 0;
  local_418.debug.name.field_2._M_local_buf[0] = '\0';
  local_418.debug.targetName._M_dataplus._M_p = (pointer)&local_418.debug.targetName.field_2;
  local_418.debug.targetName._M_string_length = 0;
  local_418.debug.targetName.field_2._M_local_buf[0] = '\0';
  local_418.debug.libraryPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.debug.libraryPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_418.debug.headerPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_418.debug.libraryPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.debug.headerPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.debug.headerPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.release.name._M_dataplus._M_p = (pointer)&local_418.release.name.field_2;
  local_418.release.name._M_string_length = 0;
  local_418.release.name.field_2._M_local_buf[0] = '\0';
  local_418.release.targetName._M_dataplus._M_p = (pointer)&local_418.release.targetName.field_2;
  local_418.release.targetName._M_string_length = 0;
  local_418.release.targetName.field_2._M_local_buf[0] = '\0';
  local_418.release.headerPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.release.headerPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.release.headerPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_418.release.libraryPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.release.libraryPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.release.libraryPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"LINUX_MAKE","");
  get_export(this,&local_450,&local_418);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p);
  }
  if (local_418.valid == false) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Using Linux Config",0x12);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    get_libraries((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_480,this,&linuxPackages_abi_cxx11_);
    p_Var4 = (_List_node_base *)&local_480;
    if (local_480._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_480) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"        include(FindPkgConfig)\n",0x1f);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"        pkg_check_modules(JUCE_LIBS REQUIRED\n",0x2d);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"            ",0xc);
      p_Var4 = (_List_node_base *)&local_480;
      while (p_Var4 = (((_List_impl *)&p_Var4->_M_next)->_M_node).super__List_node_base._M_next,
            p_Var4 != (_List_node_base *)&local_480) {
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,(char *)p_Var4[1]._M_next,(long)p_Var4[1]._M_prev);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n)\n",3);
      p_Var4 = local_480._M_impl._M_node.super__List_node_base._M_next;
    }
    if ((local_418.debug.headerPath.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_418.debug.headerPath.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) || (p_Var4 != (_List_node_base *)&local_480)) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"        target_include_directories(",0x23);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," PUBLIC\n",8);
      pbVar5 = local_418.debug.headerPath.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = local_418.debug.headerPath.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_480._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_480)
      {
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,"            ${JUCE_LIBS_INCLUDE_DIRS}\n",0x26);
        pbVar5 = local_418.debug.headerPath.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar1 = local_418.debug.headerPath.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      for (; pbVar2 = local_418.debug.headerPath.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
          pbVar5 != local_418.debug.headerPath.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
        local_418.debug.headerPath.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar1;
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,"            ${CMAKE_SYSROOT}/",0x1d);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,(pbVar5->_M_dataplus)._M_p,pbVar5->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        pbVar1 = local_418.debug.headerPath.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_418.debug.headerPath.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar2;
      }
      local_418.debug.headerPath.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar1;
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"        )\n",10);
    }
    if (local_418.extraCompilerFlags._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"        target_compile_options(",0x1f);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," PUBLIC ",8);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_418.extraCompilerFlags._M_dataplus._M_p,
                          local_418.extraCompilerFlags._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
    }
    if (local_418.debug.libraryPath.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_418.debug.libraryPath.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"        target_link_directories(",0x20);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," BEFORE PUBLIC\n",0xf);
      pbVar1 = local_418.debug.libraryPath.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar5 = local_418.debug.libraryPath.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1
          ) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,"            ${CMAKE_SYSROOT}/",0x1d);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,(pbVar5->_M_dataplus)._M_p,pbVar5->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"        )\n",10);
    }
    get_libraries((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_468,this,&linuxLibs_abi_cxx11_);
    if (((local_418.externalLibraries.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_418.externalLibraries.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) ||
        (local_480._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_480))
       || (local_468._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_468)
       ) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"        target_link_libraries(",0x1e);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      pbVar1 = local_418.externalLibraries.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar5 = local_418.externalLibraries.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1
          ) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"            ",0xc);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,(pbVar5->_M_dataplus)._M_p,pbVar5->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      }
      if (local_480._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_480)
      {
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,"            ${JUCE_LIBS_LIBRARIES}\n",0x23);
      }
      if (local_468._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_468)
      {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"            ",0xc);
        get_libraries((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_430,this,&linuxLibs_abi_cxx11_);
        p_Var4 = (_List_node_base *)&local_430;
        while (p_Var4 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
              p_Var4 != (_List_node_base *)&local_430) {
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_1a8,(char *)p_Var4[1]._M_next,(long)p_Var4[1]._M_prev);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        }
        std::__cxx11::
        _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_clear(&local_430);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"        )\n",10);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&local_468);
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&local_480);
  }
  buildExport::~buildExport(&local_418);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string project::get_linux_config()
{
    std::stringstream ss;

    project::buildExport b;
    get_export("LINUX_MAKE", b);
    if(!b.valid)
    {
        return "";
    }
    std::cout << "Using Linux Config" << std::endl;

    auto packages = get_libraries(linuxPackages);
    if(!packages.empty())
    {
        ss << "\n";
        ss << "        include(FindPkgConfig)\n";
        ss << "        pkg_check_modules(JUCE_LIBS REQUIRED\n";
        ss << "            ";
        for(auto const& package : packages)
        {
            ss << package << " ";
        }
        ss << "\n)\n";
    }
    if(!b.debug.headerPath.empty() || !packages.empty())
    {
        ss << "\n";
        ss << "        target_include_directories(" << name << " PUBLIC\n";
        if(!packages.empty())
        {
            ss << "            ${JUCE_LIBS_INCLUDE_DIRS}\n";
        }
        for(auto const& path : b.debug.headerPath)
        {
            ss << "            ${CMAKE_SYSROOT}/" << path << "\n";
        }
        ss << "        )\n";
    }
    if(!b.extraCompilerFlags.empty())
    {
        ss << "\n";
        ss << "        target_compile_options(" << name << " PUBLIC " << b.extraCompilerFlags << ")\n";
    }
    if(!b.debug.libraryPath.empty())
    {
        ss << "\n";
        ss << "        target_link_directories(" << name << " BEFORE PUBLIC\n";
        for(auto const& path : b.debug.libraryPath)
        {
            ss << "            ${CMAKE_SYSROOT}/" << path << "\n";
        }
        ss << "        )\n";
    }

    auto libs = get_libraries(linuxLibs);
    if(!b.externalLibraries.empty() || !packages.empty() || !libs.empty())
    {
        ss << "\n";
        ss << "        target_link_libraries(" << name << "\n";
        for(auto const& library : b.externalLibraries)
        {
            ss << "            " << library << "\n";
        }
        if(!packages.empty())
        {
            ss << "            ${JUCE_LIBS_LIBRARIES}\n";
        }
        if(!libs.empty())
        {
            ss << "            ";
            for(auto const& lib : get_libraries(linuxLibs))
            {
                ss << lib << " ";
            }
            ss << "\n";
        }
        ss << "        )\n";
    }

    return ss.str();
}